

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Client __thiscall
capnp::reverseMembrane(capnp *this,Client *inner,Own<capnp::MembranePolicy> *policy)

{
  ClientHook *pCVar1;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> OVar2;
  Client CVar3;
  Own<capnp::ClientHook> local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_28.disposer = (inner->hook).disposer;
  local_28.ptr = (inner->hook).ptr;
  (inner->hook).ptr = (ClientHook *)0x0;
  OVar2 = anon_unknown_0::membrane((anon_unknown_0 *)&local_18,&local_28,policy->ptr,true);
  pCVar1 = OVar2.ptr;
  *(undefined4 *)this = local_18;
  *(undefined4 *)(this + 4) = uStack_14;
  *(undefined4 *)(this + 8) = uStack_10;
  *(undefined4 *)(this + 0xc) = uStack_c;
  if (local_28.ptr != (ClientHook *)0x0) {
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,
               (local_28.ptr)->_vptr_ClientHook[-2] + (long)&(local_28.ptr)->_vptr_ClientHook);
    pCVar1 = extraout_RDX;
  }
  CVar3.hook.ptr = pCVar1;
  CVar3.hook.disposer = (Disposer *)this;
  return (Client)CVar3.hook;
}

Assistant:

Capability::Client reverseMembrane(Capability::Client inner, kj::Own<MembranePolicy> policy) {
  return Capability::Client(membrane(
      ClientHook::from(kj::mv(inner)), *policy, true));
}